

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3s.cc
# Opt level: O0

void __thiscall trng::yarn3s::seed(yarn3s *this,unsigned_long s)

{
  int64_t t;
  unsigned_long s_local;
  yarn3s *this_local;
  
  t = (long)s % 0x7fffadb3;
  if (t < 0) {
    t = t + 0x7fffadb3;
  }
  (this->S).r[0] = (int)t;
  (this->S).r[1] = 1;
  (this->S).r[2] = 1;
  return;
}

Assistant:

void yarn3s::seed(unsigned long s) {
    int64_t t(s);
    t %= modulus;
    if (t < 0)
      t += modulus;
    S.r[0] = static_cast<result_type>(t);
    S.r[1] = 1;
    S.r[2] = 1;
  }